

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O2

Pln_Man_t * Pln_ManAlloc(Gia_Man_t *pGia,Vec_Int_t *vOrder)

{
  Pln_Man_t *pPVar1;
  Hsh_VecMan_t *p;
  Hsh_VecMan_t *p_00;
  Vec_Que_t *pVVar2;
  int *piVar3;
  Vec_Flt_t *p_01;
  float *pfVar4;
  Vec_Int_t *p_02;
  Vec_Int_t *vVec;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  ulong uVar8;
  char *__function;
  char *__file;
  int nEntries;
  char *__assertion;
  size_t __size;
  uint uVar9;
  
  nEntries = 1;
  pPVar1 = (Pln_Man_t *)calloc(1,0x70);
  pPVar1->pGia = pGia;
  p = Hsh_VecManStart(nEntries);
  pPVar1->pHashC = p;
  p_00 = Hsh_VecManStart(nEntries);
  pPVar1->pHashM = p_00;
  pVVar2 = (Vec_Que_t *)calloc(1,0x20);
  pVVar2->nCap = 0x3e9;
  pVVar2->nSize = 1;
  piVar3 = (int *)malloc(0xfa4);
  memset(piVar3,0xff,0xfa4);
  pVVar2->pHeap = piVar3;
  piVar3 = (int *)malloc(0xfa4);
  memset(piVar3,0xff,0xfa4);
  pVVar2->pOrder = piVar3;
  pPVar1->vQue = pVVar2;
  p_01 = (Vec_Flt_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  pfVar4 = (float *)malloc(4000);
  p_01->pArray = pfVar4;
  pPVar1->vCounts = p_01;
  p_02 = Vec_IntAlloc(1000);
  pPVar1->vCoefs = p_02;
  vVec = Vec_IntAlloc(100);
  pPVar1->vTempC[0] = vVec;
  pVVar5 = Vec_IntAlloc(100);
  pPVar1->vTempC[1] = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  pPVar1->vTempM[0] = pVVar5;
  pVVar6 = Vec_IntAlloc(100);
  pPVar1->vTempM[1] = pVVar6;
  pVVar6 = Vec_IntAlloc(100);
  pPVar1->vTempM[2] = pVVar6;
  pVVar6 = Vec_IntAlloc(100);
  pPVar1->vTempM[3] = pVVar6;
  if (vOrder == (Vec_Int_t *)0x0) {
    uVar9 = pGia->nObjs;
    pVVar6 = Vec_IntAlloc(uVar9);
    pVVar6->nSize = uVar9;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar9) {
      uVar8 = (ulong)uVar9;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      pVVar6->pArray[uVar7] = (int)uVar7;
    }
  }
  else {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    uVar9 = vOrder->nSize;
    pVVar6->nSize = uVar9;
    pVVar6->nCap = uVar9;
    if ((long)(int)uVar9 == 0) {
      __size = 0;
      piVar3 = (int *)0x0;
    }
    else {
      __size = (long)(int)uVar9 << 2;
      piVar3 = (int *)malloc(__size);
    }
    pVVar6->pArray = piVar3;
    memcpy(piVar3,vOrder->pArray,__size);
  }
  pPVar1->vOrder = pVVar6;
  if (uVar9 == pGia->nObjs) {
    if (pVVar2->pCostsFlt == (float **)0x0) {
      pVVar2->pCostsFlt = &p_01->pArray;
      Hsh_VecManAdd(p,vVec);
      Hsh_VecManAdd(p_00,pVVar5);
      Vec_FltPush(p_01,0.0);
      Vec_IntPush(p_02,0);
      return pPVar1;
    }
    __assertion = "p->pCostsFlt == NULL";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
    ;
    __function = "void Vec_QueSetPriority(Vec_Que_t *, float **)";
    uVar9 = 0x61;
  }
  else {
    __assertion = "Vec_IntSize(p->vOrder) == Gia_ManObjNum(pGia)";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
    ;
    __function = "Pln_Man_t *Pln_ManAlloc(Gia_Man_t *, Vec_Int_t *)";
    uVar9 = 0x5c;
  }
  __assert_fail(__assertion,__file,uVar9,__function);
}

Assistant:

Pln_Man_t * Pln_ManAlloc( Gia_Man_t * pGia, Vec_Int_t * vOrder )
{
    Pln_Man_t * p = ABC_CALLOC( Pln_Man_t, 1 );
    p->pGia      = pGia;
    p->pHashC    = Hsh_VecManStart( 1000 );
    p->pHashM    = Hsh_VecManStart( 1000 );
    p->vQue      = Vec_QueAlloc( 1000 );
    p->vCounts   = Vec_FltAlloc( 1000 );
    p->vCoefs    = Vec_IntAlloc( 1000 );
    p->vTempC[0] = Vec_IntAlloc( 100 );
    p->vTempC[1] = Vec_IntAlloc( 100 );
    p->vTempM[0] = Vec_IntAlloc( 100 );
    p->vTempM[1] = Vec_IntAlloc( 100 );
    p->vTempM[2] = Vec_IntAlloc( 100 );
    p->vTempM[3] = Vec_IntAlloc( 100 );
    p->vOrder    = vOrder ? Vec_IntDup(vOrder) : Vec_IntStartNatural( Gia_ManObjNum(pGia) );
    assert( Vec_IntSize(p->vOrder) == Gia_ManObjNum(pGia) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // add 0-constant and 1-monomial
    Hsh_VecManAdd( p->pHashC, p->vTempC[0] );
    Hsh_VecManAdd( p->pHashM, p->vTempM[0] );
    Vec_FltPush( p->vCounts, 0 );
    Vec_IntPush( p->vCoefs, 0 );
    return p;
}